

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void leaveFullscreenMode(_GLFWwindow *window)

{
  undefined8 local_18;
  unsigned_long value;
  _GLFWwindow *window_local;
  
  value = (unsigned_long)window;
  _glfwRestoreVideoMode(window->monitor);
  _glfw.x11.saver.count = _glfw.x11.saver.count + -1;
  if (_glfw.x11.saver.count == 0) {
    XSetScreenSaver(_glfw.x11.display,_glfw.x11.saver.timeout,_glfw.x11.saver.interval,
                    _glfw.x11.saver.blanking,_glfw.x11.saver.exposure);
  }
  if (_glfw.x11.NET_WM_BYPASS_COMPOSITOR != 0) {
    local_18 = 0;
    XChangeProperty(_glfw.x11.display,*(undefined8 *)(value + 0x270),
                    _glfw.x11.NET_WM_BYPASS_COMPOSITOR,6,0x20,0,&local_18,1);
  }
  if ((_glfw.x11.NET_WM_STATE != 0) && (_glfw.x11.NET_WM_STATE_FULLSCREEN != 0)) {
    changeWindowState((_GLFWwindow *)value,_glfw.x11.NET_WM_STATE_FULLSCREEN,L'\0');
  }
  return;
}

Assistant:

static void leaveFullscreenMode(_GLFWwindow* window)
{
    _glfwRestoreVideoMode(window->monitor);

    _glfw.x11.saver.count--;

    if (_glfw.x11.saver.count == 0)
    {
        // Restore old screen saver settings
        XSetScreenSaver(_glfw.x11.display,
                        _glfw.x11.saver.timeout,
                        _glfw.x11.saver.interval,
                        _glfw.x11.saver.blanking,
                        _glfw.x11.saver.exposure);
    }

    if (_glfw.x11.NET_WM_BYPASS_COMPOSITOR)
    {
        const unsigned long value = 0;

        XChangeProperty(_glfw.x11.display,  window->x11.handle,
                        _glfw.x11.NET_WM_BYPASS_COMPOSITOR, XA_CARDINAL, 32,
                        PropModeReplace, (unsigned char*) &value, 1);
    }

    if (_glfw.x11.NET_WM_STATE && _glfw.x11.NET_WM_STATE_FULLSCREEN)
    {
        // Ask the window manager to make the GLFW window a normal window
        // Normal windows usually have frames and other decorations

        changeWindowState(window,
                          _glfw.x11.NET_WM_STATE_FULLSCREEN,
                          _NET_WM_STATE_REMOVE);
    }
}